

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

APInt __thiscall llvm::APInt::zext(APInt *this,uint width)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint64_t *__dest;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  undefined4 in_register_00000034;
  uint64_t *__src;
  ulong __n;
  APInt AVar5;
  
  __src = (uint64_t *)CONCAT44(in_register_00000034,width);
  uVar1 = (uint)__src[1];
  if (uVar1 < in_EDX) {
    if (in_EDX < 0x41) {
      APInt(this,in_EDX,*__src,false);
      uVar4 = extraout_RDX;
    }
    else {
      iVar2 = (int)((ulong)in_EDX + 0x3f >> 6);
      __dest = (uint64_t *)operator_new__((ulong)(uint)(iVar2 * 8));
      this->BitWidth = in_EDX;
      (this->U).pVal = __dest;
      if (0x40 < uVar1) {
        __src = (uint64_t *)*__src;
      }
      iVar3 = (int)((ulong)uVar1 + 0x3f >> 6);
      __n = (ulong)(uint)(iVar3 * 8);
      memcpy(__dest,__src,__n);
      memset((void *)((long)__dest + __n),0,(ulong)(uint)((iVar2 - iVar3) * 8));
      uVar4 = extraout_RDX_00;
    }
    AVar5._8_8_ = uVar4;
    AVar5.U.pVal = (uint64_t *)this;
    return AVar5;
  }
  __assert_fail("width > BitWidth && \"Invalid APInt ZeroExtend request\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x361,"APInt llvm::APInt::zext(unsigned int) const");
}

Assistant:

APInt APInt::zext(unsigned width) const {
  assert(width > BitWidth && "Invalid APInt ZeroExtend request");

  if (width <= APINT_BITS_PER_WORD)
    return APInt(width, U.VAL);

  APInt Result(getMemory(getNumWords(width)), width);

  // Copy words.
  std::memcpy(Result.U.pVal, getRawData(), getNumWords() * APINT_WORD_SIZE);

  // Zero remaining words.
  std::memset(Result.U.pVal + getNumWords(), 0,
              (Result.getNumWords() - getNumWords()) * APINT_WORD_SIZE);

  return Result;
}